

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

float forcefloat(tagval *v)

{
  byte *__nptr;
  int iVar1;
  long lVar2;
  char *pcVar3;
  double dVar4;
  anon_union_8_5_08252708_for_identval_0 local_20;
  float local_14;
  
  iVar1 = v->type;
  local_14 = 0.0;
  switch(iVar1) {
  case 1:
    local_14 = (float)(v->super_identval).field_0.i;
    goto LAB_00132fad;
  case 2:
    return (v->super_identval).field_0.f;
  case 3:
  case 6:
    __nptr = (byte *)(v->super_identval).field_0.s;
    dVar4 = strtod((char *)__nptr,&local_20.s);
    if ((((dVar4 != 0.0) || (NAN(dVar4))) || ((byte *)local_20.s == __nptr)) ||
       ((byte)(*local_20.s | 0x20U) != 0x78)) {
      local_14 = (float)dVar4;
    }
    else {
      lVar2 = strtol((char *)__nptr,(char **)0x0,0);
      local_14 = (float)(int)lVar2;
    }
    iVar1 = v->type;
  }
  pcVar3 = (v->super_identval).field_0.s;
  if (iVar1 == 5) {
    if (*(int *)(pcVar3 + -4) != 0) goto LAB_00132fad;
    pcVar3 = pcVar3 + -4;
  }
  else if ((iVar1 != 3) || (pcVar3 == (char *)0x0)) goto LAB_00132fad;
  operator_delete__(pcVar3);
LAB_00132fad:
  v->type = 2;
  (v->super_identval).field_0.f = local_14;
  return local_14;
}

Assistant:

static inline float forcefloat(tagval &v)
{
    float f = 0.0f;
    switch(v.type)
    {
        case VAL_INT: f = v.i; break;
        case VAL_STR: f = parsefloat(v.s); break;
        case VAL_MACRO: f = parsefloat(v.s); break;
        case VAL_FLOAT: return v.f;
    }
    freearg(v);
    v.setfloat(f);
    return f;
}